

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_hq.cpp
# Opt level: O2

size_t duckdb_brotli::BrotliZopfliComputeShortestPath
                 (MemoryManager *m,size_t num_bytes,size_t position,uint8_t *ringbuffer,
                 size_t ringbuffer_mask,ContextLut literal_context_lut,BrotliEncoderParams *params,
                 int *dist_cache,Hasher *hasher,ZopfliNode *nodes)

{
  BackwardMatch *src2;
  ulong uVar1;
  size_t gap;
  BrotliEncoderDictionary *dictionary;
  uint32_t *puVar2;
  void *pvVar3;
  size_t sVar4;
  PreparedDictionary *pPVar5;
  size_t sVar6;
  byte bVar7;
  ulong uVar8;
  byte bVar9;
  int iVar10;
  ulong max_backward_limit;
  BackwardMatch *dst;
  ZopfliCostModel *self;
  size_t len2;
  size_t sVar11;
  size_t sVar12;
  byte bVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  undefined8 *puVar17;
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  size_t sVar21;
  ulong *puVar22;
  uint8_t *puVar23;
  uint uVar24;
  ulong *puVar25;
  ulong uVar26;
  ulong uVar27;
  long lVar28;
  BackwardMatch *pBVar29;
  ulong uVar30;
  ulong uVar31;
  uint *puVar32;
  ulong *puVar33;
  ulong uVar34;
  ulong uVar35;
  long lVar36;
  long lVar37;
  ulong uVar38;
  size_t len1;
  ulong uVar39;
  bool bVar40;
  ulong local_2f8;
  ulong local_2f0;
  BackwardMatch *local_2e0;
  uint local_2d8;
  ulong local_2c8;
  long local_2b8;
  ulong local_2b0;
  long local_2a8;
  uint local_298;
  size_t local_290;
  ulong local_230;
  uint32_t local_1d8 [40];
  StartPosQueue queue;
  
  sVar12 = params->stream_offset;
  max_backward_limit = (1L << ((byte)params->lgwin & 0x3f)) - 0x10;
  uVar14 = 0x145;
  if (params->quality < 0xb) {
    uVar14 = 0x96;
  }
  dst = (BackwardMatch *)BrotliAllocate(m,0xc00);
  lVar37 = num_bytes - 0x7f;
  if (num_bytes < 0x7f) {
    lVar37 = 0;
  }
  gap = (params->dictionary).compound.total_size;
  sVar11 = (params->dictionary).compound.num_chunks;
  self = (ZopfliCostModel *)BrotliAllocate(m,0x26a8);
  nodes->length = 0;
  (nodes->u).cost = 0.0;
  InitZopfliCostModel(m,self,&params->dist,num_bytes);
  ZopfliCostModelSetFromLiteralCosts(self,position,ringbuffer,ringbuffer_mask);
  queue.idx_ = 0;
  uVar8 = (ulong)(sVar11 != 0);
  src2 = dst + uVar8 * 0x100;
  local_290 = 0;
  do {
    if (num_bytes <= local_290 + 3) {
      CleanupZopfliCostModel(m,self);
      BrotliFree(m,self);
      BrotliFree(m,dst);
      sVar12 = ComputeShortestPathFromNodes(num_bytes,nodes);
      return sVar12;
    }
    uVar1 = local_290 + position;
    uVar20 = max_backward_limit;
    if (uVar1 < max_backward_limit) {
      uVar20 = uVar1;
    }
    uVar27 = uVar1 + sVar12;
    if (max_backward_limit <= uVar27) {
      uVar27 = max_backward_limit;
    }
    if ((params->dictionary).contextual.context_based == 0) {
      uVar18 = 0;
    }
    else {
      if (uVar1 == 0) {
        bVar13 = 0;
LAB_00e32445:
        uVar18 = 0;
      }
      else {
        bVar13 = ringbuffer[uVar1 - 1 & ringbuffer_mask];
        if (uVar1 == 1) goto LAB_00e32445;
        uVar18 = (ulong)ringbuffer[uVar1 - 2 & ringbuffer_mask];
      }
      uVar18 = (ulong)(params->dictionary).contextual.context_map
                      [literal_context_lut[uVar18 + 0x100] | literal_context_lut[bVar13]];
    }
    dictionary = (params->dictionary).contextual.dict[uVar18];
    uVar16 = num_bytes - local_290;
    uVar18 = 0x10;
    if (params->quality == 0xb) {
      uVar18 = 0x40;
    }
    uVar26 = 0;
    if (uVar18 <= uVar1) {
      uVar26 = uVar1 - uVar18;
    }
    puVar22 = (ulong *)(ringbuffer + (uVar1 & ringbuffer_mask));
    uVar18 = uVar1;
    uVar30 = 1;
    local_2e0 = src2;
    while (((uVar18 = uVar18 - 1, uVar26 < uVar18 && (uVar30 < 3)) && (uVar1 - uVar18 <= uVar20))) {
      if (((uint8_t)*puVar22 == ringbuffer[uVar18 & ringbuffer_mask]) &&
         (puVar25 = (ulong *)(ringbuffer + (uVar18 & ringbuffer_mask)),
         *(uint8_t *)((long)puVar22 + 1) == *(uint8_t *)((long)puVar25 + 1))) {
        lVar28 = 0;
        uVar31 = uVar16;
        puVar33 = puVar22;
LAB_00e32535:
        if (uVar31 < 8) {
          for (uVar38 = 0;
              (uVar31 != uVar38 &&
              (*(uint8_t *)((long)puVar25 + uVar38) == *(uint8_t *)((long)puVar33 + uVar38)));
              uVar38 = uVar38 + 1) {
          }
          uVar38 = uVar38 - lVar28;
        }
        else {
          if (*puVar33 == *puVar25) goto code_r0x00e32546;
          uVar38 = *puVar25 ^ *puVar33;
          uVar31 = 0;
          if (uVar38 != 0) {
            for (; (uVar38 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
            }
          }
          uVar38 = (uVar31 >> 3 & 0x1fffffff) - lVar28;
        }
        if (uVar30 < uVar38) {
          local_2e0->distance = (uint32_t)(uVar1 - uVar18);
          local_2e0->length_and_code = (int)uVar38 << 5;
          local_2e0 = local_2e0 + 1;
          uVar30 = uVar38;
        }
      }
    }
    local_298 = (uint)ringbuffer_mask;
    if (uVar30 < uVar16) {
      uVar15 = (uint)((int)*puVar22 * 0x1e35a7bd) >> 0xf;
      uVar18 = (hasher->privat)._H5.bucket_size_;
      puVar2 = (hasher->privat)._H2.buckets_;
      pvVar3 = (hasher->privat)._H40.extra[1];
      uVar24 = puVar2[uVar15];
      uVar26 = uVar16;
      if (0x7f < uVar16) {
        puVar2[uVar15] = (uint32_t)uVar1;
        uVar26 = 0x80;
      }
      uVar31 = uVar18 & uVar1;
      local_2a8 = uVar31 * 2 + 1;
      local_2b8 = uVar31 * 2;
      uVar31 = 0;
      local_2c8 = 0;
      lVar28 = 0x40;
      while (uVar38 = uVar1 - uVar24, uVar38 != 0) {
        bVar40 = lVar28 == 0;
        lVar28 = lVar28 + -1;
        if ((uVar20 < uVar38) || (bVar40)) break;
        uVar34 = local_2c8;
        if (uVar31 < local_2c8) {
          uVar34 = uVar31;
        }
        puVar25 = (ulong *)((long)puVar22 + uVar34);
        puVar33 = (ulong *)(ringbuffer + uVar34 + (uVar24 & local_298));
        uVar35 = uVar16 - uVar34;
        lVar19 = 0;
LAB_00e3269b:
        if (uVar35 < 8) {
          for (uVar39 = 0;
              (uVar35 != uVar39 &&
              (*(uint8_t *)((long)puVar25 + uVar39) == *(uint8_t *)((long)puVar33 + uVar39)));
              uVar39 = uVar39 + 1) {
          }
        }
        else {
          if (*puVar33 == *puVar25) goto code_r0x00e326ad;
          uVar39 = *puVar25 ^ *puVar33;
          uVar35 = 0;
          if (uVar39 != 0) {
            for (; (uVar39 >> uVar35 & 1) == 0; uVar35 = uVar35 + 1) {
            }
          }
          uVar39 = uVar35 >> 3 & 0x1fffffff;
        }
        uVar34 = (uVar39 - lVar19) + uVar34;
        if (local_2e0 == (BackwardMatch *)0x0) {
          local_2e0 = (BackwardMatch *)0x0;
        }
        else if (uVar30 < uVar34) {
          local_2e0->distance = (uint32_t)uVar38;
          local_2e0->length_and_code = (int)uVar34 << 5;
          local_2e0 = local_2e0 + 1;
          uVar30 = uVar34;
        }
        uVar15 = (uint)uVar18;
        if (uVar26 <= uVar34) {
          if (uVar16 < 0x80) goto LAB_00e3280b;
          *(undefined4 *)((long)pvVar3 + local_2b8 * 4) =
               *(undefined4 *)((long)pvVar3 + (ulong)(uVar15 & uVar24) * 8);
          iVar10 = *(int *)((long)pvVar3 + (ulong)(uVar15 & uVar24) * 8 + 4);
          goto LAB_00e327f6;
        }
        if (ringbuffer[uVar34 + (uVar24 & local_298)] < *(byte *)((long)puVar22 + uVar34)) {
          if (0x7f < uVar16) {
            *(uint *)((long)pvVar3 + local_2b8 * 4) = uVar24;
          }
          lVar19 = (ulong)(uVar24 & uVar15) * 2 + 1;
          uVar31 = uVar34;
          local_2b8 = lVar19;
        }
        else {
          if (0x7f < uVar16) {
            *(uint *)((long)pvVar3 + local_2a8 * 4) = uVar24;
          }
          lVar19 = (ulong)(uVar24 & uVar15) * 2;
          local_2c8 = uVar34;
          local_2a8 = lVar19;
        }
        uVar24 = *(uint *)((long)pvVar3 + lVar19 * 4);
      }
      if (0x7f < uVar16) {
        iVar10 = (hasher->privat)._H5.hash_shift_;
        *(int *)((long)pvVar3 + local_2b8 * 4) = iVar10;
LAB_00e327f6:
        *(int *)((long)pvVar3 + local_2a8 * 4) = iVar10;
      }
    }
LAB_00e3280b:
    for (lVar28 = 0; lVar28 != 0x26; lVar28 = lVar28 + 1) {
      local_1d8[lVar28] = 0xfffffff;
    }
    uVar20 = uVar30 + 1;
    if (uVar30 + 1 < 5) {
      uVar20 = 4;
    }
    iVar10 = BrotliFindAllStaticDictionaryMatches
                       (dictionary,(uint8_t *)puVar22,uVar20,uVar16,local_1d8);
    if (iVar10 != 0) {
      uVar18 = 0x25;
      if (uVar16 < 0x25) {
        uVar18 = uVar16;
      }
      iVar10 = (int)uVar20 << 5;
      for (; uVar20 <= uVar18; uVar20 = uVar20 + 1) {
        uVar24 = local_1d8[uVar20];
        if ((uVar24 < 0xfffffff) &&
           (uVar26 = (ulong)(uVar24 >> 5) + gap + 1 + uVar27, uVar26 <= (params->dist).max_distance)
           ) {
          uVar24 = uVar24 & 0x1f;
          local_2e0->distance = (uint32_t)uVar26;
          if (uVar20 == uVar24) {
            uVar24 = 0;
          }
          local_2e0->length_and_code = uVar24 + iVar10;
          local_2e0 = local_2e0 + 1;
        }
        iVar10 = iVar10 + 0x20;
      }
    }
    len2 = (long)local_2e0 - (long)src2 >> 3;
    sVar11 = (params->dictionary).compound.num_chunks;
    if (sVar11 != 0) {
      sVar4 = (params->dictionary).compound.total_size;
      uVar20 = (params->dist).max_distance;
      local_230 = 3;
      len1 = 0;
      for (sVar21 = 0; sVar21 != sVar11; sVar21 = sVar21 + 1) {
        pPVar5 = (params->dictionary).compound.chunks[sVar21];
        bVar13 = (byte)pPVar5->bucket_bits;
        bVar9 = (byte)pPVar5->slot_bits;
        bVar7 = -(char)pPVar5->hash_bits;
        uVar18 = ((*puVar22 << (bVar7 & 0x3f)) >> (bVar7 & 0x3f)) * 0x1fe35a7bd3579bd3 >>
                 (-bVar13 & 0x3f);
        lVar28 = (1L << (bVar9 & 0x3f)) * 4;
        lVar19 = (1L << (bVar13 & 0x3f)) * 2;
        bVar9 = -bVar9;
        uVar24 = (uint)*(ushort *)((long)&pPVar5[1].magic + (uVar18 & 0xffffffff) * 2 + lVar28);
        puVar17 = (undefined8 *)
                  ((long)&pPVar5[1].magic + (ulong)pPVar5->num_items * 4 + lVar19 + lVar28);
        if (pPVar5->magic != 0xdebcede0) {
          puVar17 = (undefined8 *)*puVar17;
        }
        sVar6 = (params->dictionary).compound.chunk_offsets[sVar21];
        pBVar29 = dst + uVar8 * 0x100 + -0x40 + len1;
        uVar15 = pPVar5->source_size;
        puVar32 = (uint *)((long)&pPVar5[1].magic +
                          (ulong)(uVar24 + (&pPVar5[1].magic)
                                           [(uint)((int)uVar18 << (bVar9 & 0x1f)) >> (bVar9 & 0x1f)]
                                 ) * 4 + lVar19 + lVar28);
        uVar24 = (uint)(uVar24 == 0xffff);
        lVar28 = 0;
        uVar18 = local_230;
        do {
          uVar26 = (uVar1 & ringbuffer_mask) + uVar18;
          do {
            do {
              if (uVar24 != 0) goto LAB_00e32bb7;
              uVar24 = *puVar32;
              puVar32 = puVar32 + 1;
              uVar31 = (ulong)(uVar24 & 0x7fffffff);
              uVar24 = uVar24 & 0x80000000;
              uVar38 = ((uVar27 + sVar4) - sVar6) - uVar31;
              uVar30 = uVar15 - uVar31;
              if (uVar16 <= uVar30) {
                uVar30 = uVar16;
              }
            } while ((((uVar20 < uVar38) || (ringbuffer_mask < uVar26)) || (uVar30 <= uVar18)) ||
                    (ringbuffer[uVar26] != *(uint8_t *)((long)puVar17 + uVar18 + uVar31)));
            lVar19 = (long)puVar17 + uVar31;
            uVar35 = 0;
            lVar36 = 0;
            puVar25 = puVar22;
            uVar34 = uVar30;
LAB_00e32af4:
            if (7 < uVar34) {
              if (*puVar25 == *(ulong *)(lVar19 + uVar35)) goto code_r0x00e32b06;
              uVar31 = *(ulong *)(lVar19 + uVar35) ^ *puVar25;
              uVar30 = 0;
              if (uVar31 != 0) {
                for (; (uVar31 >> uVar30 & 1) == 0; uVar30 = uVar30 + 1) {
                }
              }
              uVar30 = (uVar30 >> 3 & 0x1fffffff) - lVar36;
              goto LAB_00e32b71;
            }
            lVar36 = uVar31 + uVar30 + (long)puVar17;
            for (; uVar30 != uVar35; uVar35 = uVar35 + 1) {
              if (*(uint8_t *)(lVar19 + uVar35) != *(uint8_t *)((long)puVar22 + uVar35)) {
                lVar36 = uVar35 + lVar19;
                break;
              }
            }
            uVar30 = lVar36 - lVar19;
LAB_00e32b71:
          } while (uVar30 <= uVar18);
          pBVar29->distance = (uint32_t)uVar38;
          pBVar29->length_and_code = (int)uVar30 << 5;
          pBVar29 = pBVar29 + 1;
          lVar28 = lVar28 + 1;
          uVar18 = uVar30;
        } while (lVar28 != 0x40 - len1);
LAB_00e32bb7:
        len1 = len1 + lVar28;
        if (len1 != 0) {
          if (len1 == 0x40) break;
          local_230 = (ulong)(src2[len1 - 0x41].length_and_code >> 5);
        }
      }
      MergeMatches(dst,dst + uVar8 * 0x100 + -0x40,len1,src2,len2);
      len2 = len2 + len1;
    }
    if (len2 == 0) {
      len2 = 0;
    }
    else if (uVar14 < dst[len2 - 1].length_and_code >> 5) {
      *dst = dst[len2 - 1];
      len2 = 1;
    }
    sVar11 = UpdateNodes(num_bytes,position,local_290,ringbuffer,ringbuffer_mask,params,
                         max_backward_limit,dist_cache,len2,dst,self,&queue,nodes);
    uVar20 = 0;
    if (0x3fff < sVar11) {
      uVar20 = sVar11;
    }
    if (((len2 == 1) && (uVar24 = dst->length_and_code >> 5, uVar14 < uVar24)) && (uVar20 < uVar24))
    {
      uVar20 = (ulong)uVar24;
    }
    if (1 < uVar20) {
      uVar27 = uVar1 + 1;
      uVar18 = uVar20 + uVar1;
      if (lVar37 + position <= uVar20 + uVar1) {
        uVar18 = lVar37 + position;
      }
      uVar16 = uVar18 - 0x3f;
      if (uVar18 < uVar1 + 0x40) {
        uVar16 = uVar27;
      }
      if (uVar1 + 0x201 <= uVar16) {
        for (; uVar27 < uVar16; uVar27 = uVar27 + 8) {
          uVar1 = (hasher->privat)._H5.bucket_size_;
          puVar2 = (hasher->privat)._H2.buckets_;
          uVar30 = uVar27 & ringbuffer_mask;
          pvVar3 = (hasher->privat)._H40.extra[1];
          uVar15 = (uint)(*(int *)(ringbuffer + uVar30) * 0x1e35a7bd) >> 0xf;
          uVar24 = puVar2[uVar15];
          local_2f0 = (uVar1 & uVar27) * 2 + 1;
          local_2f8 = (uVar1 & uVar27) * 2;
          puVar2[uVar15] = (uint32_t)uVar27;
          uVar26 = 0;
          local_2b0 = 0;
          lVar28 = 0x40;
          while (uVar27 != uVar24) {
            bVar40 = lVar28 == 0;
            lVar28 = lVar28 + -1;
            if ((uVar1 - 0xf < uVar27 - uVar24) || (bVar40)) break;
            uVar31 = local_2b0;
            if (uVar26 < local_2b0) {
              uVar31 = uVar26;
            }
            puVar22 = (ulong *)(ringbuffer + uVar31 + (uVar24 & local_298));
            uVar38 = 0x80 - uVar31;
            lVar19 = 0;
            puVar25 = (ulong *)(ringbuffer + uVar31 + uVar30);
LAB_00e32e3c:
            if (7 < uVar38) {
              if (*puVar22 == *puVar25) goto code_r0x00e32e4f;
              uVar34 = *puVar25 ^ *puVar22;
              uVar38 = 0;
              if (uVar34 != 0) {
                for (; (uVar34 >> uVar38 & 1) == 0; uVar38 = uVar38 + 1) {
                }
              }
              lVar19 = (uVar38 >> 3 & 0x1fffffff) - lVar19;
              goto LAB_00e32e95;
            }
            for (uVar34 = 0; puVar23 = ringbuffer + uVar30 + 0x80, uVar38 != uVar34;
                uVar34 = uVar34 + 1) {
              if (*(char *)((long)puVar25 + uVar34) != *(char *)((long)puVar22 + uVar34)) {
                puVar23 = (uint8_t *)((long)puVar25 + uVar34);
                break;
              }
            }
            lVar19 = (long)puVar23 - (long)(ringbuffer + uVar31 + uVar30);
LAB_00e32e95:
            uVar31 = lVar19 + uVar31;
            local_2d8 = (uint)uVar1;
            if (0x7f < uVar31) {
              *(undefined4 *)((long)pvVar3 + local_2f8 * 4) =
                   *(undefined4 *)((long)pvVar3 + (ulong)(local_2d8 & uVar24) * 8);
              iVar10 = *(int *)((long)pvVar3 + (ulong)(local_2d8 & uVar24) * 8 + 4);
              goto LAB_00e32f27;
            }
            uVar38 = (ulong)(uVar24 & local_2d8) * 2;
            if (ringbuffer[uVar31 + (uVar24 & local_298)] < ringbuffer[uVar31 + uVar30]) {
              *(uint *)((long)pvVar3 + local_2f8 * 4) = uVar24;
              uVar38 = uVar38 | 1;
              uVar26 = uVar31;
              local_2f8 = uVar38;
            }
            else {
              *(uint *)((long)pvVar3 + local_2f0 * 4) = uVar24;
              local_2f0 = uVar38;
              local_2b0 = uVar31;
            }
            uVar24 = *(uint *)((long)pvVar3 + uVar38 * 4);
          }
          iVar10 = (hasher->privat)._H5.hash_shift_;
          *(int *)((long)pvVar3 + local_2f8 * 4) = iVar10;
LAB_00e32f27:
          *(int *)((long)pvVar3 + local_2f0 * 4) = iVar10;
        }
      }
      for (; uVar16 < uVar18; uVar16 = uVar16 + 1) {
        uVar1 = (hasher->privat)._H5.bucket_size_;
        puVar2 = (hasher->privat)._H2.buckets_;
        uVar26 = uVar16 & ringbuffer_mask;
        pvVar3 = (hasher->privat)._H40.extra[1];
        uVar15 = (uint)(*(int *)(ringbuffer + uVar26) * 0x1e35a7bd) >> 0xf;
        uVar24 = puVar2[uVar15];
        local_2f0 = (uVar1 & uVar16) * 2 + 1;
        local_2f8 = (uVar1 & uVar16) * 2;
        puVar2[uVar15] = (uint32_t)uVar16;
        local_2b0 = 0;
        uVar27 = 0;
        lVar28 = 0x40;
        while (uVar16 != uVar24) {
          bVar40 = lVar28 == 0;
          lVar28 = lVar28 + -1;
          if ((uVar1 - 0xf < uVar16 - uVar24) || (bVar40)) break;
          uVar30 = uVar27;
          if (local_2b0 < uVar27) {
            uVar30 = local_2b0;
          }
          puVar22 = (ulong *)(ringbuffer + uVar30 + (uVar24 & local_298));
          uVar31 = 0x80 - uVar30;
          lVar19 = 0;
          puVar25 = (ulong *)(ringbuffer + uVar30 + uVar26);
LAB_00e33019:
          if (7 < uVar31) {
            if (*puVar22 == *puVar25) goto code_r0x00e3302b;
            uVar38 = *puVar25 ^ *puVar22;
            uVar31 = 0;
            if (uVar38 != 0) {
              for (; (uVar38 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
              }
            }
            lVar19 = (uVar31 >> 3 & 0x1fffffff) - lVar19;
            goto LAB_00e33070;
          }
          for (uVar38 = 0; puVar23 = ringbuffer + uVar26 + 0x80, uVar31 != uVar38;
              uVar38 = uVar38 + 1) {
            if (*(char *)((long)puVar25 + uVar38) != *(char *)((long)puVar22 + uVar38)) {
              puVar23 = (uint8_t *)((long)puVar25 + uVar38);
              break;
            }
          }
          lVar19 = (long)puVar23 - (long)(ringbuffer + uVar30 + uVar26);
LAB_00e33070:
          uVar30 = lVar19 + uVar30;
          local_2d8 = (uint)uVar1;
          if (0x7f < uVar30) {
            *(undefined4 *)((long)pvVar3 + local_2f8 * 4) =
                 *(undefined4 *)((long)pvVar3 + (ulong)(local_2d8 & uVar24) * 8);
            iVar10 = *(int *)((long)pvVar3 + (ulong)(local_2d8 & uVar24) * 8 + 4);
            goto LAB_00e330fd;
          }
          uVar31 = (ulong)(uVar24 & local_2d8) * 2;
          if (ringbuffer[uVar30 + (uVar24 & local_298)] < ringbuffer[uVar30 + uVar26]) {
            *(uint *)((long)pvVar3 + local_2f8 * 4) = uVar24;
            uVar31 = uVar31 | 1;
            local_2f8 = uVar31;
            local_2b0 = uVar30;
          }
          else {
            *(uint *)((long)pvVar3 + local_2f0 * 4) = uVar24;
            uVar27 = uVar30;
            local_2f0 = uVar31;
          }
          uVar24 = *(uint *)((long)pvVar3 + uVar31 * 4);
        }
        iVar10 = (hasher->privat)._H5.hash_shift_;
        *(int *)((long)pvVar3 + local_2f8 * 4) = iVar10;
LAB_00e330fd:
        *(int *)((long)pvVar3 + local_2f0 * 4) = iVar10;
      }
      while (uVar20 = uVar20 - 1, uVar20 != 0) {
        if (num_bytes <= local_290 + 4) {
          local_290 = local_290 + 1;
          break;
        }
        local_290 = local_290 + 1;
        EvaluateNode(sVar12 + position,local_290,max_backward_limit,gap,dist_cache,self,&queue,nodes
                    );
      }
    }
    local_290 = local_290 + 1;
  } while( true );
code_r0x00e32546:
  puVar33 = puVar33 + 1;
  puVar25 = puVar25 + 1;
  uVar31 = uVar31 - 8;
  lVar28 = lVar28 + -8;
  goto LAB_00e32535;
code_r0x00e326ad:
  puVar33 = puVar33 + 1;
  puVar25 = puVar25 + 1;
  uVar35 = uVar35 - 8;
  lVar19 = lVar19 + -8;
  goto LAB_00e3269b;
code_r0x00e32b06:
  puVar25 = puVar25 + 1;
  uVar34 = uVar34 - 8;
  lVar36 = lVar36 + -8;
  uVar35 = uVar35 + 8;
  goto LAB_00e32af4;
code_r0x00e32e4f:
  puVar22 = puVar22 + 1;
  puVar25 = puVar25 + 1;
  uVar38 = uVar38 - 8;
  lVar19 = lVar19 + -8;
  goto LAB_00e32e3c;
code_r0x00e3302b:
  puVar22 = puVar22 + 1;
  puVar25 = puVar25 + 1;
  uVar31 = uVar31 - 8;
  lVar19 = lVar19 + -8;
  goto LAB_00e33019;
}

Assistant:

size_t duckdb_brotli::BrotliZopfliComputeShortestPath(MemoryManager* m, size_t num_bytes,
    size_t position, const uint8_t* ringbuffer, size_t ringbuffer_mask,
    ContextLut literal_context_lut, const BrotliEncoderParams* params,
    const int* dist_cache, Hasher* hasher, ZopfliNode* nodes) {
  const size_t stream_offset = params->stream_offset;
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);
  const size_t max_zopfli_len = MaxZopfliLen(params);
  StartPosQueue queue;
  BackwardMatch* BROTLI_RESTRICT matches =
      BROTLI_ALLOC(m, BackwardMatch, 2 * (MAX_NUM_MATCHES_H10 + 64));
  const size_t store_end = num_bytes >= StoreLookaheadH10() ?
      position + num_bytes - StoreLookaheadH10() + 1 : position;
  size_t i;
  const CompoundDictionary* addon = &params->dictionary.compound;
  size_t gap = addon->total_size;
  size_t lz_matches_offset =
      (addon->num_chunks != 0) ? (MAX_NUM_MATCHES_H10 + 128) : 0;
  ZopfliCostModel* model = BROTLI_ALLOC(m, ZopfliCostModel, 1);
  if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(model) || BROTLI_IS_NULL(matches)) {
    return 0;
  }
  nodes[0].length = 0;
  nodes[0].u.cost = 0;
  InitZopfliCostModel(m, model, &params->dist, num_bytes);
  if (BROTLI_IS_OOM(m)) return 0;
  ZopfliCostModelSetFromLiteralCosts(
      model, position, ringbuffer, ringbuffer_mask);
  InitStartPosQueue(&queue);
  for (i = 0; i + HashTypeLengthH10() - 1 < num_bytes; i++) {
    const size_t pos = position + i;
    const size_t max_distance = BROTLI_MIN(size_t, pos, max_backward_limit);
    const size_t dictionary_start = BROTLI_MIN(size_t,
        pos + stream_offset, max_backward_limit);
    size_t skip;
    size_t num_matches;
    int dict_id = 0;
    if (params->dictionary.contextual.context_based) {
      uint8_t p1 = pos >= 1 ?
          ringbuffer[(size_t)(pos - 1) & ringbuffer_mask] : 0;
      uint8_t p2 = pos >= 2 ?
          ringbuffer[(size_t)(pos - 2) & ringbuffer_mask] : 0;
      dict_id = params->dictionary.contextual.context_map[
          BROTLI_CONTEXT(p1, p2, literal_context_lut)];
    }
    num_matches = FindAllMatchesH10(&hasher->privat._H10,
        params->dictionary.contextual.dict[dict_id],
        ringbuffer, ringbuffer_mask, pos, num_bytes - i, max_distance,
        dictionary_start + gap, params, &matches[lz_matches_offset]);
    if (addon->num_chunks != 0) {
      size_t cd_matches = LookupAllCompoundDictionaryMatches(addon,
          ringbuffer, ringbuffer_mask, pos, 3, num_bytes - i,
          dictionary_start, params->dist.max_distance,
          &matches[lz_matches_offset - 64], 64);
      MergeMatches(matches, &matches[lz_matches_offset - 64], cd_matches,
          &matches[lz_matches_offset], num_matches);
      num_matches += cd_matches;
    }
    if (num_matches > 0 &&
        BackwardMatchLength(&matches[num_matches - 1]) > max_zopfli_len) {
      matches[0] = matches[num_matches - 1];
      num_matches = 1;
    }
    skip = UpdateNodes(num_bytes, position, i, ringbuffer, ringbuffer_mask,
        params, max_backward_limit, dist_cache, num_matches, matches, model,
        &queue, nodes);
    if (skip < BROTLI_LONG_COPY_QUICK_STEP) skip = 0;
    if (num_matches == 1 && BackwardMatchLength(&matches[0]) > max_zopfli_len) {
      skip = BROTLI_MAX(size_t, BackwardMatchLength(&matches[0]), skip);
    }
    if (skip > 1) {
      /* Add the tail of the copy to the hasher. */
      StoreRangeH10(&hasher->privat._H10,
          ringbuffer, ringbuffer_mask, pos + 1, BROTLI_MIN(
          size_t, pos + skip, store_end));
      skip--;
      while (skip) {
        i++;
        if (i + HashTypeLengthH10() - 1 >= num_bytes) break;
        EvaluateNode(position + stream_offset, i, max_backward_limit, gap,
            dist_cache, model, &queue, nodes);
        skip--;
      }
    }
  }
  CleanupZopfliCostModel(m, model);
  BROTLI_FREE(m, model);
  BROTLI_FREE(m, matches);
  return ComputeShortestPathFromNodes(num_bytes, nodes);
}